

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_281dd4::check<signed_char>(istream *is,char c)

{
  undefined8 in_RAX;
  ostream *poVar1;
  char v;
  
  v = (char)((ulong)in_RAX >> 0x38);
  std::istream::read((char *)is,(long)&v);
  poVar1 = std::operator<<((ostream *)&std::cout,_LogicExc + (*_LogicExc == '*'));
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = std::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = std::operator<<(poVar1,v);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (v == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = signed char]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}